

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O0

unsigned_long Hop_Hash(Hop_Obj_t *pObj,int TableSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Hop_Obj_t *pHVar6;
  unsigned_long Key;
  int TableSize_local;
  Hop_Obj_t *pObj_local;
  
  iVar3 = Hop_ObjIsExor(pObj);
  pHVar6 = Hop_ObjFanin0(pObj);
  iVar1 = pHVar6->Id;
  pHVar6 = Hop_ObjFanin1(pObj);
  iVar2 = pHVar6->Id;
  iVar4 = Hop_ObjFaninC0(pObj);
  iVar5 = Hop_ObjFaninC1(pObj);
  return (ulong)(long)(iVar5 * 0x161 ^
                      iVar4 * 0x38f ^ iVar2 * 0xb9b ^ iVar1 * 0x1f01 ^ iVar3 * 0x6a3) %
         (ulong)(long)TableSize;
}

Assistant:

long Hop_Hash( Hop_Obj_t * pObj, int TableSize ) 
{
    unsigned long Key = Hop_ObjIsExor(pObj) * 1699;
    Key ^= Hop_ObjFanin0(pObj)->Id * 7937;
    Key ^= Hop_ObjFanin1(pObj)->Id * 2971;
    Key ^= Hop_ObjFaninC0(pObj) * 911;
    Key ^= Hop_ObjFaninC1(pObj) * 353;
    return Key % TableSize;
}